

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::~ImplicitProducer(ImplicitProducer *this)

{
  FreeList<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
  *pFVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict2 _Var3;
  ulong uVar4;
  ulong uVar5;
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits> *pCVar6;
  __pointer_type pBVar7;
  __int_type_conflict _Var8;
  __int_type_conflict _Var9;
  BlockIndexEntry *pBVar10;
  Block *pBVar11;
  BlockIndexHeader *pBVar12;
  __pointer_type pBVar13;
  __pointer_type pBVar14;
  __pointer_type pBVar15;
  ulong uVar16;
  bool bVar17;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ImplicitProducer_0015bba8;
  uVar4 = (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  uVar5 = (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i;
  if (uVar5 != uVar4 && uVar5 - uVar4 < 0x8000000000000001) {
    __assert_fail("index == tail || details::circular_less_than(index, tail)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                  ,0x937,
                  "virtual moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::~ImplicitProducer() [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                 );
  }
  if (uVar5 != uVar4) {
    pBVar15 = (__pointer_type)0x0;
    uVar16 = uVar5;
    do {
      if (pBVar15 == (__pointer_type)0x0 || (uVar16 & 0x1f) == 0) {
        if (pBVar15 != (__pointer_type)0x0) {
          pCVar6 = (this->super_ProducerBase).parent;
          LOCK();
          paVar2 = &pBVar15->freeListRefs;
          _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
          UNLOCK();
          if (_Var3 == 0) {
            pBVar13 = (pCVar6->freeList).freeListHead._M_b._M_p;
            do {
              (pBVar15->freeListNext)._M_b._M_p = pBVar13;
              (pBVar15->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
              pFVar1 = &pCVar6->freeList;
              LOCK();
              pBVar14 = (pFVar1->freeListHead)._M_b._M_p;
              bVar17 = pBVar13 == pBVar14;
              if (bVar17) {
                (pFVar1->freeListHead)._M_b._M_p = pBVar15;
                pBVar14 = pBVar13;
              }
              UNLOCK();
              if (bVar17) break;
              LOCK();
              paVar2 = &pBVar15->freeListRefs;
              _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
              (paVar2->super___atomic_base<unsigned_int>)._M_i =
                   (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
              UNLOCK();
              pBVar13 = pBVar14;
            } while (_Var3 == 1);
          }
        }
        pBVar7 = (this->blockIndex)._M_b._M_p;
        _Var8 = (pBVar7->tail).super___atomic_base<unsigned_long>._M_i;
        _Var9 = (pBVar7->index[_Var8]->key).super___atomic_base<unsigned_long>._M_i;
        if (_Var9 == 1) {
          __assert_fail("tailBase != INVALID_BLOCK_BASE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                        ,0xb25,
                        "size_t moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::get_block_index_index_for_index(index_t, BlockIndexHeader *&) const [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                       );
        }
        pBVar10 = pBVar7->index
                  [pBVar7->capacity - 1 & ((uVar16 & 0xffffffffffffffe0) - _Var9 >> 5) + _Var8];
        if (((pBVar10->key).super___atomic_base<unsigned_long>._M_i != (uVar16 & 0xffffffffffffffe0)
            ) || ((pBVar10->value)._M_b._M_p == (__pointer_type)0x0)) {
          __assert_fail("localBlockIndex->index[idx]->key.load(std::memory_order_relaxed) == index && localBlockIndex->index[idx]->value.load(std::memory_order_relaxed) != nullptr"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                        ,0xb2a,
                        "size_t moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::get_block_index_index_for_index(index_t, BlockIndexHeader *&) const [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                       );
        }
        pBVar15 = (pBVar10->value)._M_b._M_p;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar4);
  }
  pBVar11 = (this->super_ProducerBase).tailBlock;
  if ((pBVar11 != (Block *)0x0) && ((uVar4 & 0x1f) != 0 || uVar5 != uVar4)) {
    pCVar6 = (this->super_ProducerBase).parent;
    LOCK();
    paVar2 = &pBVar11->freeListRefs;
    _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
    (paVar2->super___atomic_base<unsigned_int>)._M_i =
         (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
    UNLOCK();
    if (_Var3 == 0) {
      pBVar15 = (pCVar6->freeList).freeListHead._M_b._M_p;
      do {
        (pBVar11->freeListNext)._M_b._M_p = pBVar15;
        (pBVar11->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
        pFVar1 = &pCVar6->freeList;
        LOCK();
        pBVar13 = (pFVar1->freeListHead)._M_b._M_p;
        bVar17 = pBVar15 == pBVar13;
        if (bVar17) {
          (pFVar1->freeListHead)._M_b._M_p = pBVar11;
          pBVar13 = pBVar15;
        }
        UNLOCK();
        if (bVar17) break;
        LOCK();
        paVar2 = &pBVar11->freeListRefs;
        _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
        (paVar2->super___atomic_base<unsigned_int>)._M_i =
             (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
        UNLOCK();
        pBVar15 = pBVar13;
      } while (_Var3 == 1);
    }
  }
  pBVar7 = (this->blockIndex)._M_b._M_p;
  while (pBVar7 != (__pointer_type)0x0) {
    pBVar12 = pBVar7->prev;
    free(pBVar7);
    pBVar7 = pBVar12;
  }
  return;
}

Assistant:

~ImplicitProducer()
		{
			// Note that since we're in the destructor we can assume that all enqueue/dequeue operations
			// completed already; this means that all undequeued elements are placed contiguously across
			// contiguous blocks, and that only the first and last remaining blocks can be only partially
			// empty (all other remaining blocks must be completely full).
			
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
			// Unregister ourselves for thread termination notification
			if (!this->inactive.load(std::memory_order_relaxed)) {
				details::ThreadExitNotifier::unsubscribe(&threadExitListener);
			}
#endif
			
			// Destroy all remaining elements!
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto index = this->headIndex.load(std::memory_order_relaxed);
			Block* block = nullptr;
			assert(index == tail || details::circular_less_than(index, tail));
			bool forceFreeLastBlock = index != tail;		// If we enter the loop, then the last (tail) block will not be freed
			while (index != tail) {
				if ((index & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 || block == nullptr) {
					if (block != nullptr) {
						// Free the old block
						this->parent->add_block_to_free_list(block);
					}
					
					block = get_block_index_entry_for_index(index)->value.load(std::memory_order_relaxed);
				}
				
				((*block)[index])->~T();
				++index;
			}
			// Even if the queue is empty, there's still one block that's not on the free list
			// (unless the head index reached the end of it, in which case the tail will be poised
			// to create a new block).
			if (this->tailBlock != nullptr && (forceFreeLastBlock || (tail & static_cast<index_t>(BLOCK_SIZE - 1)) != 0)) {
				this->parent->add_block_to_free_list(this->tailBlock);
			}
			
			// Destroy block index
			auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);
			if (localBlockIndex != nullptr) {
				for (size_t i = 0; i != localBlockIndex->capacity; ++i) {
					localBlockIndex->index[i]->~BlockIndexEntry();
				}
				do {
					auto prev = localBlockIndex->prev;
					localBlockIndex->~BlockIndexHeader();
					(Traits::free)(localBlockIndex);
					localBlockIndex = prev;
				} while (localBlockIndex != nullptr);
			}
		}